

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::AttachInfo::Deserialize(AttachInfo *this,Deserializer *deserializer)

{
  AttachInfo *this_00;
  pointer pAVar1;
  _Head_base<0UL,_duckdb::AttachInfo_*,_false> local_20;
  
  this_00 = (AttachInfo *)operator_new(0x90);
  AttachInfo(this_00);
  local_20._M_head_impl = this_00;
  pAVar1 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(deserializer,200,"name",&pAVar1->name)
  ;
  pAVar1 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xc9,"path",&pAVar1->path);
  pAVar1 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
            (deserializer,0xca,"options",&pAVar1->options);
  pAVar1 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::OnCreateConflict>
            (deserializer,0xcb,"on_conflict",&pAVar1->on_conflict,ERROR_ON_CONFLICT);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> AttachInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<AttachInfo>(new AttachInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "name", result->name);
	deserializer.ReadPropertyWithDefault<string>(201, "path", result->path);
	deserializer.ReadPropertyWithDefault<unordered_map<string, Value>>(202, "options", result->options);
	deserializer.ReadPropertyWithExplicitDefault<OnCreateConflict>(203, "on_conflict", result->on_conflict, OnCreateConflict::ERROR_ON_CONFLICT);
	return std::move(result);
}